

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardPrivate::updateCurrentPage(QWizardPrivate *this)

{
  QWizard *this_00;
  bool bVar1;
  int iVar2;
  QWizardPage *pQVar3;
  
  this_00 = *(QWizard **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  pQVar3 = QWizard::currentPage(this_00);
  if (pQVar3 == (QWizardPage *)0x0) {
    this->canContinue = false;
    bVar1 = false;
  }
  else {
    iVar2 = (**(code **)(*(long *)&(this_00->super_QDialog).super_QWidget + 0x1d0))(this_00);
    this->canContinue = iVar2 != -1;
    pQVar3 = QWizard::currentPage(this_00);
    bVar1 = QWizardPage::isFinalPage(pQVar3);
  }
  this->canFinish = bVar1;
  _q_updateButtonStates(this);
  updateButtonTexts(this);
  return;
}

Assistant:

void QWizardPrivate::updateCurrentPage()
{
    Q_Q(QWizard);
    if (q->currentPage()) {
        canContinue = (q->nextId() != -1);
        canFinish = q->currentPage()->isFinalPage();
    } else {
        canContinue = false;
        canFinish = false;
    }
    _q_updateButtonStates();
    updateButtonTexts();
}